

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O1

interval_t duckdb::ToWeeksOperator::Operation<int,duckdb::interval_t>(int input)

{
  bool bVar1;
  OutOfRangeException *this;
  interval_t iVar2;
  undefined1 auVar3 [12];
  int result_1;
  interval_t result;
  int local_5c;
  string local_58;
  undefined4 local_38;
  int aiStack_34 [3];
  
  bVar1 = duckdb::TryCast::Operation<int,int>(input,&local_5c,false);
  if (!bVar1) {
    auVar3 = __cxa_allocate_exception(0x10);
    CastExceptionText<int,int>(&local_58,(duckdb *)(ulong)(uint)input,auVar3._8_4_);
    duckdb::InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_58);
    __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38 = 0;
  bVar1 = duckdb::TryMultiplyOperator::Operation<int,int,int>(local_5c,7,aiStack_34);
  if (bVar1) {
    iVar2.days = aiStack_34[0];
    iVar2.months = local_38;
    iVar2.micros = 0;
    return iVar2;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Interval value %d weeks out of range","");
  OutOfRangeException::OutOfRangeException<int>(this,&local_58,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.months = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::DAYS_PER_WEEK, result.days)) {
			throw OutOfRangeException("Interval value %d weeks out of range", input);
		}
		result.micros = 0;
		return result;
	}